

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O2

size_t __thiscall FIX::FieldMap::totalFields(FieldMap *this)

{
  _Base_ptr p_Var1;
  size_t sVar2;
  size_t sVar3;
  _Base_ptr p_Var4;
  FieldMap **group;
  _Base_ptr p_Var5;
  
  sVar2 = ((long)(this->m_fields).
                 super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x58;
  for (p_Var4 = (this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->m_groups)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    p_Var1 = p_Var4[1]._M_left;
    for (p_Var5 = p_Var4[1]._M_parent; p_Var5 != p_Var1; p_Var5 = (_Base_ptr)&p_Var5->_M_parent) {
      sVar3 = totalFields(*(FieldMap **)p_Var5);
      sVar2 = sVar2 + sVar3;
    }
  }
  return sVar2;
}

Assistant:

size_t FieldMap::totalFields() const {
  size_t result = m_fields.size();

  for (auto const &tagWithGroups : m_groups) {
    for (auto const &group : tagWithGroups.second) {
      result += group->totalFields();
    }
  }
  return result;
}